

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O0

UWORD32 ihevcd_bits_nxt(bitstrm_t *ps_bitstrm,UWORD32 u4_numbits)

{
  uint local_14;
  UWORD32 u4_bits_read;
  UWORD32 u4_numbits_local;
  bitstrm_t *ps_bitstrm_local;
  
  u4_bits_read = (ps_bitstrm->u4_cur_word << ((byte)ps_bitstrm->u4_bit_ofst & 0x1f)) >>
                 (0x20U - (char)u4_numbits & 0x1f);
  if (0x20 - u4_numbits < ps_bitstrm->u4_bit_ofst) {
    if ((0x40 - u4_numbits) - ps_bitstrm->u4_bit_ofst < 0x20) {
      local_14 = ps_bitstrm->u4_nxt_word >>
                 (('@' - (char)u4_numbits) - (char)ps_bitstrm->u4_bit_ofst & 0x1fU);
    }
    else {
      local_14 = 0;
    }
    u4_bits_read = local_14 | u4_bits_read;
  }
  return u4_bits_read;
}

Assistant:

UWORD32 ihevcd_bits_nxt(bitstrm_t *ps_bitstrm, UWORD32 u4_numbits)
{
    UWORD32 u4_bits_read;

    BITS_NXT(u4_bits_read,
             ps_bitstrm->pu4_buf,
             ps_bitstrm->u4_bit_ofst,
             ps_bitstrm->u4_cur_word,
             ps_bitstrm->u4_nxt_word,
             u4_numbits);
    return u4_bits_read;
}